

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_function_expression.cpp
# Opt level: O1

bool __thiscall duckdb::BoundFunctionExpression::IsFoldable(BoundFunctionExpression *this)

{
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  type pEVar4;
  
  if ((this->function).bind_lambda == (bind_lambda_function_t)0x0) goto LAB_006bb722;
  pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&this->bind_info);
  if (pFVar3[4]._vptr_FunctionData == (_func_int **)0x0) {
LAB_006bb71c:
    bVar1 = false;
  }
  else {
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)(pFVar3 + 4));
    iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar4);
    bVar1 = true;
    if ((char)iVar2 == '\0') goto LAB_006bb71c;
  }
  if (bVar1) {
    return false;
  }
LAB_006bb722:
  if ((this->function).super_BaseScalarFunction.stability == VOLATILE) {
    return false;
  }
  bVar1 = Expression::IsFoldable(&this->super_Expression);
  return bVar1;
}

Assistant:

bool BoundFunctionExpression::IsFoldable() const {
	// functions with side effects cannot be folded: they have to be executed once for every row
	if (function.bind_lambda) {
		// This is a lambda function
		D_ASSERT(bind_info);
		auto &lambda_bind_data = bind_info->Cast<ListLambdaBindData>();
		if (lambda_bind_data.lambda_expr) {
			auto &expr = *lambda_bind_data.lambda_expr;
			if (expr.IsVolatile()) {
				return false;
			}
		}
	}
	return function.stability == FunctionStability::VOLATILE ? false : Expression::IsFoldable();
}